

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_gen.c
# Opt level: O2

yajl_gen_status yajl_gen_map_open(yajl_gen g)

{
  yajl_print_t p_Var1;
  void *pvVar2;
  uint uVar3;
  ulong uVar4;
  size_t sVar5;
  uint _i;
  yajl_gen_status yVar6;
  yajl_gen_status yVar7;
  uint uVar8;
  char *pcVar9;
  
  switch(g->state[g->depth]) {
  case yajl_gen_map_start:
  case yajl_gen_map_key:
    return yajl_gen_keys_must_be_strings;
  case yajl_gen_map_val:
    (*g->print)(g->ctx,":",1);
    if ((g->flags & 1) == 0) goto switchD_001056f1_caseD_4;
    pcVar9 = " ";
    break;
  default:
    goto switchD_001056f1_caseD_4;
  case yajl_gen_in_array:
    (*g->print)(g->ctx,",",1);
    if ((g->flags & 1) == 0) goto switchD_001056f1_caseD_4;
    pcVar9 = "\n";
    break;
  case yajl_gen_complete:
    return yajl_gen_generation_complete;
  case yajl_gen_error:
    return yajl_gen_in_error_state;
  }
  (*g->print)(g->ctx,pcVar9,1);
switchD_001056f1_caseD_4:
  uVar3 = g->depth;
  uVar4 = (ulong)uVar3;
  if (((g->flags & 1) != 0) && (g->state[uVar4] != yajl_gen_map_val)) {
    for (uVar8 = 0; uVar3 = (uint)uVar4, uVar8 < uVar3; uVar8 = uVar8 + 1) {
      p_Var1 = g->print;
      pvVar2 = g->ctx;
      pcVar9 = g->indentString;
      sVar5 = strlen(pcVar9);
      (*p_Var1)(pvVar2,pcVar9,sVar5 & 0xffffffff);
      uVar4 = (ulong)g->depth;
    }
  }
  uVar3 = uVar3 + 1;
  g->depth = uVar3;
  if (uVar3 < 0x80) {
    g->state[uVar3] = yajl_gen_map_start;
    (*g->print)(g->ctx,"{",1);
    yVar6 = yajl_gen_status_ok;
    yVar7 = yajl_gen_status_ok;
    if ((((g->flags & 1) != 0) && ((*g->print)(g->ctx,"\n",1), yVar7 = yVar6, (g->flags & 1) != 0))
       && (g->state[g->depth] == yajl_gen_complete)) {
      (*g->print)(g->ctx,"\n",1);
    }
  }
  else {
    yVar7 = yajl_max_depth_exceeded;
  }
  return yVar7;
}

Assistant:

yajl_gen_status
yajl_gen_map_open(yajl_gen g)
{
    ENSURE_VALID_STATE; ENSURE_NOT_KEY; INSERT_SEP; INSERT_WHITESPACE;
    INCREMENT_DEPTH;

    g->state[g->depth] = yajl_gen_map_start;
    g->print(g->ctx, "{", 1);
    if ((g->flags & yajl_gen_beautify)) g->print(g->ctx, "\n", 1);
    FINAL_NEWLINE;
    return yajl_gen_status_ok;
}